

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  StringOutputStream *pSVar3;
  size_type sVar4;
  int iVar5;
  mapped_type *ppbVar6;
  ulong uVar7;
  ostream *poVar8;
  mapped_type pbVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  LogMessage *other;
  ulong uVar13;
  size_type sVar14;
  ulong uVar15;
  pointer pcVar16;
  uint uVar17;
  ulong uVar18;
  pointer pcVar19;
  bool bVar20;
  SubstituteArg *in_stack_fffffffffffffda8;
  MemoryOutputStream *pMVar21;
  string indent_;
  string magic_string;
  SubstituteArg local_1e8;
  LogMessage local_1b8;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_00425ca8;
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
    (this->inner_).ptr_ = (StringOutputStream *)0x0;
  }
  ppbVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,&this->filename_);
  if ((this->insertion_point_)._M_string_length == 0) {
    if (*ppbVar6 == (mapped_type)0x0) {
      pbVar9 = (mapped_type)operator_new(0x20);
      (pbVar9->_M_dataplus)._M_p = (pointer)&pbVar9->field_2;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      *ppbVar6 = pbVar9;
      std::__cxx11::string::swap((string *)pbVar9);
      goto LAB_00203f91;
    }
    if (this->append_mode_ == true) {
      std::__cxx11::string::_M_append((char *)*ppbVar6,(ulong)(this->data_)._M_dataplus._M_p);
      goto LAB_00203f91;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": Tried to write the same file twice.",0x25);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  else {
    psVar1 = &this->data_;
    sVar4 = (this->data_)._M_string_length;
    if ((sVar4 != 0) && ((psVar1->_M_dataplus)._M_p[sVar4 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)psVar1);
    }
    pbVar9 = *ppbVar6;
    if (pbVar9 != (mapped_type)0x0) {
      local_1b8._0_8_ = (this->insertion_point_)._M_dataplus._M_p;
      local_1b8.filename_._0_4_ = (undefined4)(this->insertion_point_)._M_string_length;
      local_1e8.text_ = (char *)0x0;
      local_1e8.size_ = -1;
      indent_._M_dataplus._M_p = (pointer)0x0;
      indent_._M_string_length._0_4_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&magic_string,(strings *)"@@protoc_insertion_point($0)",(char *)&local_1b8,
                 &local_1e8,(SubstituteArg *)&indent_,&local_180,&local_60,&local_90,&local_c0,
                 &local_f0,&local_120,&local_150,in_stack_fffffffffffffda8);
      uVar7 = std::__cxx11::string::find((char *)pbVar9,(ulong)magic_string._M_dataplus._M_p,0);
      if (uVar7 == 0xffffffffffffffff) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                            (this->filename_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": insertion point \"",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(this->insertion_point_)._M_dataplus._M_p,
                            (this->insertion_point_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" not found.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar7 < 4) {
          bVar20 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_1e8,(ulong)pbVar9);
          iVar5 = std::__cxx11::string::compare((char *)&local_1e8);
          bVar20 = iVar5 == 0;
          if (local_1e8.text_ != local_1e8.scratch_ + 4) {
            operator_delete(local_1e8.text_,local_1e8.scratch_._4_8_ + 1);
          }
        }
        if (bVar20) {
          uVar7 = uVar7 - 3;
        }
        else {
          lVar10 = std::__cxx11::string::rfind((char)pbVar9,10);
          uVar7 = lVar10 + 1;
        }
        lVar10 = std::__cxx11::string::find_first_not_of((char *)pbVar9,0x35253b,uVar7);
        std::__cxx11::string::string((string *)&indent_,(string *)pbVar9,uVar7,lVar10 - uVar7);
        if (CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length) == 0) {
          std::__cxx11::string::replace
                    ((ulong)pbVar9,uVar7,(char *)0x0,(ulong)(this->data_)._M_dataplus._M_p);
        }
        else {
          sVar4 = (this->data_)._M_string_length;
          uVar18 = 0;
          if (sVar4 != 0) {
            sVar14 = 0;
            do {
              iVar5 = 0;
              if ((psVar1->_M_dataplus)._M_p[sVar14] == '\n') {
                iVar5 = (int)indent_._M_string_length;
              }
              uVar17 = (int)uVar18 + iVar5;
              uVar18 = (ulong)uVar17;
              sVar14 = sVar14 + 1;
            } while (sVar4 != sVar14);
            uVar18 = (ulong)(int)uVar17;
          }
          std::__cxx11::string::insert((ulong)pbVar9,uVar7,(char)sVar4 + (char)uVar18);
          if (pbVar9->_M_string_length == 0) {
            pcVar16 = (pointer)0x0;
          }
          else {
            pcVar16 = (pbVar9->_M_dataplus)._M_p;
          }
          pcVar16 = pcVar16 + uVar7;
          uVar12 = (this->data_)._M_string_length;
          pMVar21 = this;
          if (uVar12 != 0) {
            uVar13 = 0;
            do {
              memcpy(pcVar16,indent_._M_dataplus._M_p,
                     CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length));
              lVar10 = CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length);
              lVar11 = std::__cxx11::string::find((char)psVar1,10);
              uVar15 = lVar11 + 1;
              memcpy(pcVar16 + lVar10,(this->data_)._M_dataplus._M_p + uVar13,uVar15 - uVar13);
              pcVar16 = pcVar16 + lVar10 + (uVar15 - uVar13);
              uVar12 = (this->data_)._M_string_length;
              uVar13 = uVar15;
            } while (uVar15 < uVar12);
          }
          this = pMVar21;
          if (pbVar9->_M_string_length == 0) {
            pcVar19 = (pointer)0x0;
          }
          else {
            pcVar19 = (pbVar9->_M_dataplus)._M_p;
          }
          if (pcVar16 != pcVar19 + uVar12 + uVar18 + uVar7) {
            internal::LogMessage::LogMessage
                      (&local_1b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x2cc);
            other = internal::LogMessage::operator<<
                              (&local_1b8,
                               "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                              );
            internal::LogFinisher::operator=((LogFinisher *)&local_180,other);
            internal::LogMessage::~LogMessage(&local_1b8);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indent_._M_dataplus._M_p != &indent_.field_2) {
          operator_delete(indent_._M_dataplus._M_p,indent_.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)magic_string._M_dataplus._M_p != &magic_string.field_2) {
        operator_delete(magic_string._M_dataplus._M_p,magic_string.field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_00203f91;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,": Tried to insert into file that doesn\'t exist.",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  this->directory_->had_error_ = true;
LAB_00203f91:
  pSVar3 = (this->inner_).ptr_;
  if (pSVar3 != (StringOutputStream *)0x0) {
    (*(pSVar3->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
  }
  pcVar16 = (this->data_)._M_dataplus._M_p;
  paVar2 = &(this->data_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  pcVar16 = (this->insertion_point_)._M_dataplus._M_p;
  paVar2 = &(this->insertion_point_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  pcVar16 = (this->filename_)._M_dataplus._M_p;
  paVar2 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16 != paVar2) {
    operator_delete(pcVar16,paVar2->_M_allocated_capacity + 1);
  }
  io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      if (append_mode_) {
        (*map_slot)->append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doesn't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      std::cerr << filename_
                << ": Tried to insert into file that doesn't exist."
                << std::endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      std::cerr << filename_ << ": insertion point \"" << insertion_point_
                << "\" not found." << std::endl;
      directory_->had_error_ = true;
      return;
    }

    if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
      // Support for inline "/* @@protoc_insertion_point() */"
      pos = pos - 3;
    } else {
      // Seek backwards to the beginning of the line, which is where we will
      // insert the data.  Note that this has the effect of pushing the
      // insertion point down, so the data is inserted before it.  This is
      // intentional because it means that multiple insertions at the same point
      // will end up in the expected order in the final output.
      pos = target->find_last_of('\n', pos);
      if (pos == string::npos) {
        // Insertion point is on the first line.
        pos = 0;
      } else {
        // Advance to character after '\n'.
        ++pos;
      }
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}